

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_lexer.cpp
# Opt level: O0

bool __thiscall Lexer::parseStringLiteral(Lexer *this,bool raw_string,int open_char)

{
  int iVar1;
  char *__nptr;
  ulonglong uVar2;
  ulong uVar3;
  iterator __x;
  int in_EDX;
  byte in_SIL;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  U u_1;
  iterator listIt;
  U u;
  string hex;
  int digitsLimit;
  int ch;
  int beginLine;
  int beginColumn;
  string tok;
  int in_stack_00000158;
  int in_stack_0000015c;
  char *in_stack_00000160;
  int in_stack_0000016c;
  CompilationContext *in_stack_00000170;
  value_type *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined4 uVar5;
  Lexer *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff00;
  byte local_e9;
  string local_80 [36];
  int local_5c;
  undefined4 local_58;
  int local_44;
  undefined4 local_40;
  undefined4 local_3c;
  string local_38 [32];
  int local_18;
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  local_18 = in_EDX;
  std::__cxx11::string::string(local_38);
  *(undefined1 *)(in_RDI + 0x45) = 1;
  local_3c = *(undefined4 *)(in_RDI + 0x3c);
  local_40 = *(undefined4 *)(in_RDI + 0x38);
  local_44 = 0;
  local_44 = nextChar(in_stack_fffffffffffffee8);
  do {
    local_e9 = 0;
    if (0 < local_44) {
      local_e9 = *(byte *)(*(long *)(in_RDI + 0x48) + 0xf4) ^ 0xff;
    }
    if ((local_e9 & 1) == 0) goto LAB_00115597;
    if (local_44 == local_18) {
      if (((local_11 & 1) == 0) ||
         (iVar1 = fetchChar(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4), iVar1 != 0x22))
      break;
      local_44 = nextChar(in_stack_fffffffffffffee8);
    }
    else if ((local_44 == 0xd) || (local_44 == 10)) {
      if ((local_11 & 1) == 0) {
        CompilationContext::error
                  (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
                   in_stack_00000158);
        *(undefined1 *)(in_RDI + 0x45) = 0;
        local_1 = 0;
        goto LAB_001157a7;
      }
      if ((local_44 == 0xd) &&
         (iVar1 = fetchChar(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4), iVar1 == 10)) {
        nextChar(in_stack_fffffffffffffee8);
        local_44 = 10;
      }
    }
    else if ((local_44 == 0x5c) && ((local_11 & 1) == 0)) {
      local_44 = nextChar(in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff00 =
           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(ulong)(local_44 - 0x22);
      switch(in_stack_ffffffffffffff00) {
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0:
        local_44 = 0x22;
        break;
      default:
        CompilationContext::error
                  (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
                   in_stack_00000158);
        local_1 = 0;
        goto LAB_001157a7;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x5:
        local_44 = 0x27;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0xe:
        local_44 = 0;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x33:
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x53:
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x56:
        local_5c = 0x7fffffff;
        if (local_44 == 0x75) {
          local_5c = 4;
        }
        if (local_44 == 0x55) {
          local_5c = 8;
        }
        std::__cxx11::string::string(local_80);
        local_44 = fetchChar(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
        while ((0 < local_44 && (iVar1 = isxdigit(local_44), iVar1 != 0))) {
          std::__cxx11::string::operator+=(local_80,(char)local_44);
          nextChar(in_stack_fffffffffffffee8);
          local_5c = local_5c + -1;
          if (local_5c < 1) break;
          local_44 = fetchChar(in_stack_fffffffffffffee8,in_stack_fffffffffffffee4);
        }
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          __nptr = (char *)std::__cxx11::string::c_str();
          uVar2 = strtoull(__nptr,(char **)0x0,0x10);
          local_44 = (int)uVar2;
          local_58 = 0;
        }
        else {
          CompilationContext::error
                    (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
                     in_stack_00000158);
          local_58 = 5;
        }
        std::__cxx11::string::~string(local_80);
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3a:
        local_44 = 0x5c;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3f:
        local_44 = 7;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x40:
        local_44 = 8;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x44:
        local_44 = 0xc;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4c:
        local_44 = 10;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x50:
        local_44 = 0xd;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x52:
        local_44 = 9;
        break;
      case (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x54:
        local_44 = 0xb;
      }
    }
    std::__cxx11::string::operator+=(local_38,(char)local_44);
    in_stack_fffffffffffffefc = nextChar(in_stack_fffffffffffffee8);
    local_44 = in_stack_fffffffffffffefc;
  } while( true );
  *(undefined1 *)(in_RDI + 0x45) = 0;
LAB_00115597:
  if (local_18 == 0x27) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      CompilationContext::error
                (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
                 in_stack_00000158);
      local_1 = 0;
      goto LAB_001157a7;
    }
    uVar3 = std::__cxx11::string::length();
    if (1 < uVar3) {
      CompilationContext::error
                (in_stack_00000170,in_stack_0000016c,in_stack_00000160,in_stack_0000015c,
                 in_stack_00000158);
      local_1 = 0;
      goto LAB_001157a7;
    }
    std::__cxx11::string::operator[]((ulong)local_38);
    std::vector<Token,_std::allocator<Token>_>::push_back
              ((vector<Token,_std::allocator<Token>_> *)
               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffed8);
  }
  else {
    pVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(in_stack_ffffffffffffff00,
                     (value_type *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    uVar5 = CONCAT13(pVar4.second,(int3)in_stack_fffffffffffffee4);
    __x = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(pVar4.first._M_node._M_node,(key_type *)CONCAT44(uVar5,in_stack_fffffffffffffee0));
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x11573c);
    std::__cxx11::string::c_str();
    std::vector<Token,_std::allocator<Token>_>::push_back
              ((vector<Token,_std::allocator<Token>_> *)CONCAT44(uVar5,in_stack_fffffffffffffee0),
               (value_type *)__x._M_node);
  }
  local_1 = 1;
LAB_001157a7:
  local_58 = 1;
  std::__cxx11::string::~string(local_38);
  return (bool)(local_1 & 1);
}

Assistant:

bool Lexer::parseStringLiteral(bool raw_string, int open_char)
{
  std::string tok;
  insideString = true;
  int beginColumn = curColumn;
  int beginLine = curLine;
  int ch = 0;

  for (ch = nextChar(); ch > 0 && !ctx.isError; ch = nextChar())
  {
    if (ch == open_char)
    {
      if (raw_string && fetchChar() == '\"')
      {
        ch = nextChar();
      }
      else
      {
        insideString = false;
        break;
      }
    }
    else if (ch == 0x0d || ch == 0x0a)
    {
      if (!raw_string)
      {
        ctx.error(101, "end of line inside string literal", curLine, curColumn);
        insideString = false;
        return false;
      }

      if (ch == 0x0d && fetchChar() == 0x0a)
      {
        nextChar();
        ch = '\n';
      }
    }
    else if (ch == '\\' && !raw_string)
    {
      ch = nextChar();
      switch (ch)
      {
      case '\\': ch = '\\'; break;
      case 'a': ch = '\a'; break;
      case 'b': ch = '\b'; break;
      case 'n': ch = '\n'; break;
      case 'r': ch = '\r'; break;
      case 'v': ch = '\v'; break;
      case 't': ch = '\t'; break;
      case 'f': ch = '\f'; break;
      case '0': ch = '\0'; break;
      case '\"': ch = '\"'; break;
      case '\'': ch = '\''; break;
      case 'x':
      case 'u':
      case 'U':
      {
        int digitsLimit = INT_MAX;
        if (ch == 'u')
          digitsLimit = 4;
        if (ch == 'U')
          digitsLimit = 8;

        std::string hex;

        for (ch = fetchChar(); ch > 0; ch = fetchChar())
        {
          if (!isxdigit(ch))
            break;
          hex += char(ch);
          nextChar();

          digitsLimit--;
          if (digitsLimit <= 0)
            break;
        }

        if (hex.empty())
        {
          ctx.error(102, "hexadecimal number expected", curLine, curColumn);
          break;
        }

        ch = (int)strtoull(hex.c_str(), nullptr, 16);
      }
      break;

      default:
        ctx.error(103, "unrecognised escaper char", curLine, curColumn);
        return false;
      }
    }

    tok += char(ch);
  }

  if (open_char == '\'')
  {
    if (tok.empty())
    {
      ctx.error(104, "empty constant", curLine, curColumn);
      return false;
    }

    if (tok.length() > 1)
    {
      ctx.error(105, "constant is too long", curLine, curColumn);
      return false;
    }

    Token::U u;
    u.i = (unsigned char)tok[0];
    tokens.push_back({ (TokenType)TK_INTEGER, false, false, (unsigned short)beginColumn, beginLine, u });
  }
  else
  {
    ctx.stringList.insert(tok);
    auto listIt = ctx.stringList.find(tok);
    Token::U u;
    u.s = listIt->c_str();
    tokens.push_back({ (TokenType)TK_STRING_LITERAL, false, false, (unsigned short)beginColumn, beginLine, u });
  }

  return true;
}